

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O2

int mbedtls_gcm_setkey(mbedtls_gcm_context *ctx,mbedtls_cipher_id_t cipher,uchar *key,uint keybits)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  mbedtls_cipher_info_t *cipher_info;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uchar h [16];
  size_t local_28;
  
  cipher_info = mbedtls_cipher_info_from_values(cipher,keybits,MBEDTLS_MODE_ECB);
  iVar1 = -0x14;
  if ((cipher_info != (mbedtls_cipher_info_t *)0x0) && (cipher_info->block_size == 0x10)) {
    mbedtls_cipher_free(&ctx->cipher_ctx);
    iVar1 = mbedtls_cipher_setup(&ctx->cipher_ctx,cipher_info);
    if (iVar1 == 0) {
      iVar1 = mbedtls_cipher_setkey(&ctx->cipher_ctx,key,keybits,MBEDTLS_ENCRYPT);
      if (iVar1 == 0) {
        local_28 = 0;
        h[0] = '\0';
        h[1] = '\0';
        h[2] = '\0';
        h[3] = '\0';
        h[4] = '\0';
        h[5] = '\0';
        h[6] = '\0';
        h[7] = '\0';
        h[8] = '\0';
        h[9] = '\0';
        h[10] = '\0';
        h[0xb] = '\0';
        h[0xc] = '\0';
        h[0xd] = '\0';
        h[0xe] = '\0';
        h[0xf] = '\0';
        iVar1 = mbedtls_cipher_update(&ctx->cipher_ctx,h,0x10,h,&local_28);
        if (iVar1 == 0) {
          uVar8 = (ulong)h._0_8_ >> 0x38 | (h._0_8_ & 0xff000000000000) >> 0x28 |
                  (h._0_8_ & 0xff0000000000) >> 0x18 | (h._0_8_ & 0xff00000000) >> 8 |
                  (h._0_8_ & 0xff000000) << 8 | (h._0_8_ & 0xff0000) << 0x18 |
                  (h._0_8_ & 0xff00) << 0x28 | h._0_8_ << 0x38;
          uVar9 = (ulong)h._8_8_ >> 0x38 | (h._8_8_ & 0xff000000000000) >> 0x28 |
                  (h._8_8_ & 0xff0000000000) >> 0x18 | (h._8_8_ & 0xff00000000) >> 8 |
                  (h._8_8_ & 0xff000000) << 8 | (h._8_8_ & 0xff0000) << 0x18 |
                  (h._8_8_ & 0xff00) << 0x28 | h._8_8_ << 0x38;
          ctx->HL[8] = uVar9;
          ctx->HH[8] = uVar8;
          uVar5 = 2;
          iVar2 = mbedtls_aesni_has_support(2);
          iVar1 = 0;
          if (iVar2 == 0) {
            ctx->HH[0] = 0;
            ctx->HL[0] = 0;
            for (uVar3 = 4; uVar3 != 0; uVar3 = uVar3 >> 1) {
              uVar4 = uVar9 >> 1 | uVar8 << 0x3f;
              uVar6 = 0;
              if ((uVar9 & 1) != 0) {
                uVar6 = 0xe100000000000000;
              }
              uVar8 = uVar8 >> 1 ^ uVar6;
              ctx->HL[uVar3] = uVar4;
              ctx->HH[uVar3] = uVar8;
              uVar9 = uVar4;
            }
            iVar1 = 0;
            for (; uVar5 < 9; uVar5 = uVar5 * 2) {
              uVar4 = (ulong)uVar5;
              uVar9 = ctx->HL[uVar4];
              uVar8 = ctx->HH[uVar4];
              for (lVar7 = 0; uVar4 - 1 != lVar7; lVar7 = lVar7 + 1) {
                ctx->HH[uVar4 + lVar7 + 1] = ctx->HH[lVar7 + 1] ^ uVar8;
                ctx->HL[uVar4 + lVar7 + 1] = ctx->HL[lVar7 + 1] ^ uVar9;
              }
            }
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_gcm_setkey( mbedtls_gcm_context *ctx,
                        mbedtls_cipher_id_t cipher,
                        const unsigned char *key,
                        unsigned int keybits )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const mbedtls_cipher_info_t *cipher_info;

    GCM_VALIDATE_RET( ctx != NULL );
    GCM_VALIDATE_RET( key != NULL );
    GCM_VALIDATE_RET( keybits == 128 || keybits == 192 || keybits == 256 );

    cipher_info = mbedtls_cipher_info_from_values( cipher, keybits,
                                                   MBEDTLS_MODE_ECB );
    if( cipher_info == NULL )
        return( MBEDTLS_ERR_GCM_BAD_INPUT );

    if( cipher_info->block_size != 16 )
        return( MBEDTLS_ERR_GCM_BAD_INPUT );

    mbedtls_cipher_free( &ctx->cipher_ctx );

    if( ( ret = mbedtls_cipher_setup( &ctx->cipher_ctx, cipher_info ) ) != 0 )
        return( ret );

    if( ( ret = mbedtls_cipher_setkey( &ctx->cipher_ctx, key, keybits,
                               MBEDTLS_ENCRYPT ) ) != 0 )
    {
        return( ret );
    }

    if( ( ret = gcm_gen_table( ctx ) ) != 0 )
        return( ret );

    return( 0 );
}